

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

CNetAddr * i2p::DestBinToAddr(CNetAddr *__return_storage_ptr__,Binary *dest)

{
  long lVar1;
  uchar *data;
  bool bVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  string sStack_f8;
  string addr_str;
  uchar hash [32];
  CSHA256 hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&hasher);
  data = (dest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  CSHA256::Write(&hasher,data,
                 (long)(dest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CSHA256::Finalize(&hasher,hash);
  CNetAddr::CNetAddr(__return_storage_ptr__);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  input.m_size = 0x20;
  input.m_data = hash;
  EncodeBase32_abi_cxx11_(&sStack_f8,input,false);
  std::operator+(&addr_str,&sStack_f8,".b32.i2p");
  std::__cxx11::string::~string((string *)&sStack_f8);
  bVar2 = CNetAddr::SetSpecial(__return_storage_ptr__,&addr_str);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&addr_str);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&sStack_f8,(tinyformat *)"Cannot parse I2P address: \"%s\"",(char *)&addr_str,args);
    std::runtime_error::runtime_error(this,(string *)&sStack_f8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CNetAddr DestBinToAddr(const Binary& dest)
{
    CSHA256 hasher;
    hasher.Write(dest.data(), dest.size());
    unsigned char hash[CSHA256::OUTPUT_SIZE];
    hasher.Finalize(hash);

    CNetAddr addr;
    const std::string addr_str = EncodeBase32(hash, false) + ".b32.i2p";
    if (!addr.SetSpecial(addr_str)) {
        throw std::runtime_error(strprintf("Cannot parse I2P address: \"%s\"", addr_str));
    }

    return addr;
}